

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O0

void __thiscall tcu::TestNode::deinit(TestNode *this)

{
  size_type sVar1;
  reference ppTVar2;
  int local_14;
  int i;
  TestNode *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size(&this->m_children);
    if ((int)sVar1 <= local_14) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        (&this->m_children,(long)local_14);
    if (*ppTVar2 != (value_type)0x0) {
      (*(*ppTVar2)->_vptr_TestNode[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::clear(&this->m_children);
  return;
}

Assistant:

void TestNode::deinit (void)
{
	for (int i = 0; i < (int)m_children.size(); i++)
		delete m_children[i];
	m_children.clear();
}